

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O0

int scale_image_RGB_to_NTSC_safe(uchar *orig,int width,int height,int channels)

{
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int nc;
  int j;
  int i;
  float scale_hi;
  float scale_lo;
  undefined1 auStack_138 [264];
  int local_30;
  int local_2c;
  int local_28;
  undefined4 local_24;
  undefined4 local_20;
  int local_4;
  
  local_20 = 0x41780419;
  local_24 = 0x436b7fbe;
  if ((((in_ESI < 1) || (in_EDX < 1)) || ((int)in_ECX < 1)) || (in_RDI == 0)) {
    local_4 = 0;
  }
  else {
    for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
      auStack_138[local_28] = (char)(int)(((float)local_28 * 219.99799) / 255.0 + 15.501);
    }
    local_30 = in_ECX - (1 - (in_ECX & 1));
    for (local_28 = 0; local_28 < (int)(in_ESI * in_EDX * in_ECX); local_28 = in_ECX + local_28) {
      for (local_2c = 0; local_2c < local_30; local_2c = local_2c + 1) {
        *(undefined1 *)(in_RDI + (local_28 + local_2c)) =
             auStack_138[*(byte *)(in_RDI + (local_28 + local_2c))];
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
	scale_image_RGB_to_NTSC_safe
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	const float scale_lo = 16.0f - 0.499f;
	const float scale_hi = 235.0f + 0.499f;
	int i, j;
	int nc = channels;
	unsigned char scale_LUT[256];
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (orig == NULL) )
	{
		/*	nothing to do	*/
		return 0;
	}
	/*	set up the scaling Look Up Table	*/
	for( i = 0; i < 256; ++i )
	{
		scale_LUT[i] = (unsigned char)((scale_hi - scale_lo) * i / 255.0f + scale_lo);
	}
	/*	for channels = 2 or 4, ignore the alpha component	*/
	nc -= 1 - (channels & 1);
	/*	OK, go through the image and scale any non-alpha components	*/
	for( i = 0; i < width*height*channels; i += channels )
	{
		for( j = 0; j < nc; ++j )
		{
			orig[i+j] = scale_LUT[orig[i+j]];
		}
	}
	return 1;
}